

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void __thiscall MNS::Server::Server(Server *this)

{
  mapped_type *pmVar1;
  key_type local_2c;
  
  *(undefined8 *)&(this->onHttpRequestHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpRequestHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpRequestHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpRequestHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onHttpCancelHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpCancelHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpCancelHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpCancelHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onHttpListeningHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpListeningHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpListeningHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpListeningHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onHttpConnectionHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onHttpConnectionHandler).super__Function_base._M_functor + 8) = 0;
  (this->onHttpConnectionHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onHttpConnectionHandler)._M_invoker = (_Invoker_type)0x0;
  local_2c = 100;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x65;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x66;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 200;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0xc9;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0xca;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0xcb;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0xcc;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0xcd;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0xce;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 300;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x12d;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x12e;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x12f;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x130;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x132;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x133;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x134;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 400;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x191;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x192;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x193;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x194;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x195;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x196;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x197;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x198;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x199;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x19a;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x19b;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x19c;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x19d;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x19e;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x19f;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1a0;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1a1;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 500;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1f5;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1f6;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1f7;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1f8;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1f9;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  local_2c = 0x1ff;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&response_msgs_abi_cxx11_,&local_2c);
  std::__cxx11::string::assign((char *)pmVar1);
  loop = (uv_loop_t *)uv_default_loop();
  std::function<void_(MNS::SocketData_*)>::operator=(&this->onHttpCancelHandler,(nullptr_t)0x0);
  std::function<void_(MNS::SocketData_*)>::operator=(&this->onHttpConnectionHandler,(nullptr_t)0x0);
  std::function<void_(MNS::SocketData_*)>::operator=(&this->onHttpRequestHandler,(nullptr_t)0x0);
  this->listeningSocket = 0;
  this->timer_h = (uv_timer_t *)0x0;
  return;
}

Assistant:

MNS::Server::Server() {
	MNS::Server::response_msgs[100] = "100 Continue\r\n";
	MNS::Server::response_msgs[101] = "101 Switching Protocols\r\n";
	MNS::Server::response_msgs[102] = "102 Checkpoint\r\n";

	MNS::Server::response_msgs[200] = "200 OK\r\n";
	MNS::Server::response_msgs[201] = "201 Created\r\n";
	MNS::Server::response_msgs[202] = "202 Accepted\r\n";
	MNS::Server::response_msgs[203] = "203 Non-Authoritative Information\r\n";
	MNS::Server::response_msgs[204] = "204 No Content\r\n";
	MNS::Server::response_msgs[205] = "205 Reset Content\r\n";
	MNS::Server::response_msgs[206] = "206 Partial Content\r\n";

	MNS::Server::response_msgs[300] = "300 Multiple Choices\r\n";
	MNS::Server::response_msgs[301] = "301 Moved Permanently\r\n";
	MNS::Server::response_msgs[302] = "302 Found\r\n";
	MNS::Server::response_msgs[303] = "303 See Other\r\n";
	MNS::Server::response_msgs[304] = "304 Not Modified\r\n";
	MNS::Server::response_msgs[306] = "306 Switch Proxy\r\n";
	MNS::Server::response_msgs[307] = "307 Temporary Redirect\r\n";
	MNS::Server::response_msgs[308] = "308 Resume Incomplete\r\n";


	MNS::Server::response_msgs[400] = "400 Bad Request\r\n";
	MNS::Server::response_msgs[401] = "401 Unauthorized\r\n";
	MNS::Server::response_msgs[402] = "402 Payment Required\r\n";
	MNS::Server::response_msgs[403] = "403 Forbidden\r\n";
	MNS::Server::response_msgs[404] = "404 Not Found\r\n";
	MNS::Server::response_msgs[405] = "405 Method Not Allowed\r\n";
	MNS::Server::response_msgs[406] = "406 Not Acceptable\r\n";
	MNS::Server::response_msgs[407] = "407 Proxy Authentication Required\r\n";
	MNS::Server::response_msgs[408] = "408 Request Timeout\r\n";
	MNS::Server::response_msgs[409] = "409 Conflict\r\n";
	MNS::Server::response_msgs[410] = "410 Gone\r\n";
	MNS::Server::response_msgs[411] = "411 Length Required\r\n";
	MNS::Server::response_msgs[412] = "412 Precondition Failed\r\n";
	MNS::Server::response_msgs[413] = "413 Request Entity Too Large\r\n";
	MNS::Server::response_msgs[414] = "414 Request-URI Too Long\r\n";
	MNS::Server::response_msgs[415] = "415 Unsupported Media Type\r\n";
	MNS::Server::response_msgs[416] = "416 Requested Range Not Satisfiable\r\n";
	MNS::Server::response_msgs[417] = "417 Expectation Failed\r\n";

	MNS::Server::response_msgs[500] = "500 Internal Server Error\r\n";
	MNS::Server::response_msgs[501] = "501 Not Implemented\r\n";
	MNS::Server::response_msgs[502] = "502 Bad Gateway\r\n";
	MNS::Server::response_msgs[503] = "503 Service Unavailable\r\n";
	MNS::Server::response_msgs[504] = "504 Gateway Timeout\r\n";
	MNS::Server::response_msgs[505] = "505 HTTP Version Not Supported\r\n";
	MNS::Server::response_msgs[511] = "511 Network Authentication Required\r\n";

	loop = uv_default_loop();

	this->onHttpCancelHandler = NULL;
	this->onHttpConnectionHandler = NULL;
	this->onHttpRequestHandler = NULL;
	this->listeningSocket = 0;
	this->timer_h = NULL;
}